

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_DBL local_50;
  int local_30;
  int local_2c;
  REF_INT j;
  REF_INT i;
  REF_DBL *radius_local;
  REF_DBL *center_local;
  REF_INT n_local;
  REF_DBL *xyz_local;
  
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    center[local_2c] = 0.0;
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      center[local_2c] = xyz[local_2c + local_30 * 3] + center[local_2c];
    }
    center[local_2c] = center[local_2c] / (double)n;
  }
  *radius = 0.0;
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    dVar4 = *radius;
    dVar1 = pow(xyz[local_2c * 3] - *center,2.0);
    dVar2 = pow(xyz[local_2c * 3 + 1] - center[1],2.0);
    dVar3 = pow(xyz[local_2c * 3 + 2] - center[2],2.0);
    dVar1 = sqrt(dVar1 + dVar2 + dVar3);
    if (dVar4 <= dVar1) {
      dVar4 = pow(xyz[local_2c * 3] - *center,2.0);
      dVar1 = pow(xyz[local_2c * 3 + 1] - center[1],2.0);
      dVar2 = pow(xyz[local_2c * 3 + 2] - center[2],2.0);
      local_50 = sqrt(dVar4 + dVar1 + dVar2);
    }
    else {
      local_50 = *radius;
    }
    *radius = local_50;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz, REF_INT n,
                                                REF_DBL *center,
                                                REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += xyz[i + 3 * j];
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(*radius, sqrt(pow(xyz[0 + 3 * i] - center[0], 2) +
                                pow(xyz[1 + 3 * i] - center[1], 2) +
                                pow(xyz[2 + 3 * i] - center[2], 2)));
  return REF_SUCCESS;
}